

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseMisc(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *pxVar3;
  
  iVar1 = ctxt->disableSAX;
  do {
    if (1 < iVar1) {
      return;
    }
    xmlSkipBlankChars(ctxt);
    pxVar2 = ctxt->input;
    if (((pxVar2->flags & 0x40) == 0) && ((long)pxVar2->end - (long)pxVar2->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    pxVar3 = ctxt->input->cur;
    if (*pxVar3 != '<') {
      return;
    }
    if (pxVar3[1] == '?') {
      xmlParsePI(ctxt);
    }
    else {
      if (pxVar3[1] != '!') {
        return;
      }
      if (pxVar3[2] != '-') {
        return;
      }
      if (pxVar3[3] != '-') {
        return;
      }
      xmlParseComment(ctxt);
    }
    iVar1 = ctxt->disableSAX;
  } while( true );
}

Assistant:

void
xmlParseMisc(xmlParserCtxtPtr ctxt) {
    while (PARSER_STOPPED(ctxt) == 0) {
        SKIP_BLANKS;
        GROW;
        if ((RAW == '<') && (NXT(1) == '?')) {
	    xmlParsePI(ctxt);
        } else if (CMP4(CUR_PTR, '<', '!', '-', '-')) {
	    xmlParseComment(ctxt);
        } else {
            break;
        }
    }
}